

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cpp
# Opt level: O2

void out_RegisterNode(FileStackNode *node)

{
  FileStackNode *pFVar1;
  uint32_t uVar2;
  FileStackNode *pFVar3;
  
  do {
    pFVar3 = node;
    pFVar1 = fileStackNodes;
    if (pFVar3->ID != 0xffffffff) {
      return;
    }
    if (fileStackNodes == (FileStackNode *)0x0) {
      pFVar3->ID = 0;
    }
    else {
      uVar2 = fileStackNodes->ID + 1;
      pFVar3->ID = uVar2;
      if (uVar2 == 0xffffffff) {
        fatalerror("Reached too many file stack nodes; try splitting the file up\n");
      }
    }
    pFVar3->next = pFVar1;
    node = pFVar3->parent;
    fileStackNodes = pFVar3;
  } while (pFVar3->parent != (FileStackNode *)0x0);
  return;
}

Assistant:

void out_RegisterNode(struct FileStackNode *node)
{
	// If node is not already registered, register it (and parents), and give it a unique ID
	while (node->ID == (uint32_t)-1) {
		node->ID = getNbFileStackNodes();
		if (node->ID == (uint32_t)-1)
			fatalerror("Reached too many file stack nodes; try splitting the file up\n");
		node->next = fileStackNodes;
		fileStackNodes = node;

		// Also register the node's parents
		node = node->parent;
		if (!node)
			break;
	}
}